

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_add>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_add op;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  int local_34c;
  undefined8 *local_338;
  undefined1 (*local_328) [64];
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  
  iVar4 = in_ECX * in_R8D;
  local_34c = 0;
  auVar5 = vbroadcastss_avx512f(ZEXT416((uint)*in_RSI));
  local_338 = in_RDX;
  local_328 = in_RDI;
  for (; local_34c + 0xf < iVar4; local_34c = local_34c + 0x10) {
    auVar6 = vaddps_avx512f(*local_328,auVar5);
    local_440 = auVar6._0_8_;
    uStack_438 = auVar6._8_8_;
    uStack_430 = auVar6._16_8_;
    uStack_428 = auVar6._24_8_;
    uStack_420 = auVar6._32_8_;
    uStack_418 = auVar6._40_8_;
    uStack_410 = auVar6._48_8_;
    uStack_408 = auVar6._56_8_;
    *local_338 = local_440;
    local_338[1] = uStack_438;
    local_338[2] = uStack_430;
    local_338[3] = uStack_428;
    local_338[4] = uStack_420;
    local_338[5] = uStack_418;
    local_338[6] = uStack_410;
    local_338[7] = uStack_408;
    local_328 = local_328 + 1;
    local_338 = local_338 + 8;
  }
  fVar1 = *in_RSI;
  auVar2 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x20);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)fVar1),0x30);
  auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
  for (; local_34c + 7 < iVar4; local_34c = local_34c + 8) {
    local_160 = (float)*(undefined8 *)*local_328;
    fStack_15c = (float)((ulong)*(undefined8 *)*local_328 >> 0x20);
    fStack_158 = (float)*(undefined8 *)(*local_328 + 8);
    fStack_154 = (float)((ulong)*(undefined8 *)(*local_328 + 8) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(*local_328 + 0x10);
    fStack_14c = (float)((ulong)*(undefined8 *)(*local_328 + 0x10) >> 0x20);
    fStack_148 = (float)*(undefined8 *)(*local_328 + 0x18);
    fStack_144 = (float)((ulong)*(undefined8 *)(*local_328 + 0x18) >> 0x20);
    local_180 = auVar3._0_4_;
    fStack_17c = auVar3._4_4_;
    fStack_178 = auVar3._8_4_;
    fStack_174 = auVar3._12_4_;
    fStack_170 = auVar2._0_4_;
    fStack_16c = auVar2._4_4_;
    fStack_168 = auVar2._8_4_;
    fStack_164 = auVar2._12_4_;
    *local_338 = CONCAT44(fStack_15c + fStack_17c,local_160 + local_180);
    local_338[1] = CONCAT44(fStack_154 + fStack_174,fStack_158 + fStack_178);
    local_338[2] = CONCAT44(fStack_14c + fStack_16c,fStack_150 + fStack_170);
    local_338[3] = CONCAT44(fStack_144 + fStack_164,fStack_148 + fStack_168);
    local_328 = (undefined1 (*) [64])(*local_328 + 0x20);
    local_338 = local_338 + 4;
  }
  fVar1 = *in_RSI;
  for (; local_34c + 3 < iVar4; local_34c = local_34c + 4) {
    local_130 = (float)*(undefined8 *)*local_328;
    fStack_12c = (float)((ulong)*(undefined8 *)*local_328 >> 0x20);
    fStack_128 = (float)*(undefined8 *)(*local_328 + 8);
    fStack_124 = (float)((ulong)*(undefined8 *)(*local_328 + 8) >> 0x20);
    *local_338 = CONCAT44(fStack_12c + fVar1,local_130 + fVar1);
    local_338[1] = CONCAT44(fStack_124 + fVar1,fStack_128 + fVar1);
    local_328 = (undefined1 (*) [64])(*local_328 + 0x10);
    local_338 = local_338 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}